

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

int av1_receive_compressed_data(AV1Decoder *pbi,size_t size,uint8_t **psource)

{
  RefCntBuffer *pRVar1;
  int iVar2;
  pthread_mutex_t *ppVar3;
  AVxWorkerInterface *pAVar4;
  uint8_t *puVar5;
  ulong uVar6;
  undefined8 *puVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  RefCntBuffer **ppRVar11;
  AV1_COMMON *cm;
  
  puVar5 = *psource;
  (pbi->error).error_code = AOM_CODEC_OK;
  (pbi->error).has_detail = 0;
  if (((size == 0) && (lVar10 = (long)(pbi->common).remapped_ref_idx[0], lVar10 != -1)) &&
     (pRVar1 = (pbi->common).ref_frame_map[lVar10], pRVar1 != (RefCntBuffer *)0x0)) {
    (pRVar1->buf).corrupted = 1;
  }
  pRVar1 = (pbi->common).cur_frame;
  if (pRVar1 != (RefCntBuffer *)0x0) {
    pRVar1->ref_count = pRVar1->ref_count + -1;
    (pbi->common).cur_frame = (RefCntBuffer *)0x0;
  }
  ppVar3 = (pthread_mutex_t *)(pbi->common).buffer_pool;
  puVar7 = (undefined8 *)(*(long *)((long)ppVar3 + 0x40) + 0x538);
  pthread_mutex_lock(ppVar3);
  ppVar3 = (pthread_mutex_t *)(pbi->common).buffer_pool;
  for (uVar6 = 0; *(byte *)((long)ppVar3 + 0x48) != uVar6; uVar6 = uVar6 + 1) {
    if (*(int *)(puVar7 + -0xa7) == 0) {
      if (*(int *)(puVar7 + -3) != 0) {
        puVar7[-6] = puVar7[-2];
        puVar7[-5] = puVar7[-1];
        puVar7[-4] = *puVar7;
        *(undefined4 *)(puVar7 + -3) = 0;
        ppVar3 = (pthread_mutex_t *)(pbi->common).buffer_pool;
      }
      *(undefined4 *)(puVar7 + -0xa7) = 1;
      iVar2 = (int)uVar6;
      goto LAB_0016d001;
    }
    puVar7 = puVar7 + 0xb1c;
  }
  iVar2 = -1;
LAB_0016d001:
  pthread_mutex_unlock(ppVar3);
  if (iVar2 == -1) {
LAB_0016d0c5:
    (pbi->error).error_code = AOM_CODEC_MEM_ERROR;
    return 1;
  }
  pRVar1 = ((pbi->common).buffer_pool)->frame_bufs;
  (pbi->common).cur_frame = pRVar1 + iVar2;
  aom_invalidate_pyramid(pRVar1[iVar2].buf.y_pyramid);
  av1_invalidate_corner_list((((pbi->common).cur_frame)->buf).corners);
  pRVar1 = (pbi->common).cur_frame;
  pRVar1->interp_filter_selected[0] = 0;
  pRVar1->interp_filter_selected[1] = 0;
  pRVar1->interp_filter_selected[2] = 0;
  pRVar1->interp_filter_selected[3] = 0;
  if ((pbi->common).cur_frame == (RefCntBuffer *)0x0) goto LAB_0016d0c5;
  iVar2 = _setjmp((__jmp_buf_tag *)(pbi->error).jmp);
  if (iVar2 != 0) {
    pAVar4 = aom_get_worker_interface();
    (pbi->error).setjmp = 0;
    (*pAVar4->sync)(&pbi->lf_worker);
    lVar9 = 0;
    lVar10 = lVar9;
    for (; lVar9 < pbi->num_workers; lVar9 = lVar9 + 1) {
      (*pAVar4->sync)((AVxWorker *)((long)&pbi->tile_workers->impl_ + lVar10));
      lVar10 = lVar10 + 0x38;
    }
    release_current_frame(pbi);
    return -1;
  }
  (pbi->error).setjmp = 1;
  iVar2 = aom_decode_frame_from_obus(pbi,puVar5,puVar5 + size,psource);
  if (iVar2 < 0) {
    release_current_frame(pbi);
    goto LAB_0016d283;
  }
  ppVar3 = (pthread_mutex_t *)(pbi->common).buffer_pool;
  pthread_mutex_lock(ppVar3);
  if (iVar2 == 0) {
LAB_0016d1c7:
    decrease_ref_count((pbi->common).cur_frame,(BufferPool *)&ppVar3->__data);
  }
  else {
    if (pbi->camera_frame_header_ready == 0) {
      ppRVar11 = (pbi->common).ref_frame_map;
      for (uVar8 = (pbi->common).current_frame.refresh_frame_flags; uVar8 != 0;
          uVar8 = (int)uVar8 >> 1) {
        if ((uVar8 & 1) != 0) {
          decrease_ref_count(*ppRVar11,(BufferPool *)&ppVar3->__data);
          pRVar1 = (pbi->common).cur_frame;
          *ppRVar11 = pRVar1;
          pRVar1->ref_count = pRVar1->ref_count + 1;
        }
        ppRVar11 = ppRVar11 + 1;
      }
    }
    if (((pbi->common).show_existing_frame == 0) && ((pbi->common).show_frame == 0))
    goto LAB_0016d1c7;
    uVar6 = pbi->num_output_frames;
    if (pbi->output_all_layers == 0) {
      if (uVar6 != 0) {
        decrease_ref_count(pbi->output_frames[0],(BufferPool *)&ppVar3->__data);
      }
      pbi->output_frames[0] = (pbi->common).cur_frame;
      pbi->num_output_frames = 1;
    }
    else {
      pRVar1 = (pbi->common).cur_frame;
      if (uVar6 < 4) {
        pbi->output_frames[uVar6] = pRVar1;
        pbi->num_output_frames = uVar6 + 1;
      }
      else {
        (pRVar1->buf).corrupted = 1;
        decrease_ref_count(pRVar1,(BufferPool *)&ppVar3->__data);
        (pbi->error).error_code = AOM_CODEC_UNSUP_BITSTREAM;
      }
    }
  }
  pthread_mutex_unlock(ppVar3);
  (pbi->common).cur_frame = (RefCntBuffer *)0x0;
  if (pbi->camera_frame_header_ready == 0) {
    for (lVar10 = 0; lVar10 != 7; lVar10 = lVar10 + 1) {
      (pbi->common).remapped_ref_idx[lVar10] = -1;
    }
  }
  if (iVar2 != 0) {
    pbi->decoding_first_frame = 0;
  }
  if ((pbi->error).error_code == AOM_CODEC_OK) {
    if (((pbi->common).show_existing_frame == 0) && ((pbi->common).seg.enabled != '\0')) {
      if (((pbi->common).prev_frame == (RefCntBuffer *)0x0) ||
         (((pbi->common).mi_params.mi_rows != ((pbi->common).prev_frame)->mi_rows ||
          ((pbi->common).mi_params.mi_cols != ((pbi->common).prev_frame)->mi_cols)))) {
        puVar5 = (uint8_t *)0x0;
      }
      else {
        puVar5 = ((pbi->common).prev_frame)->seg_map;
      }
      (pbi->common).last_frame_seg_map = puVar5;
    }
    (pbi->error).setjmp = 0;
    return 0;
  }
LAB_0016d283:
  (pbi->error).setjmp = 0;
  return 1;
}

Assistant:

int av1_receive_compressed_data(AV1Decoder *pbi, size_t size,
                                const uint8_t **psource) {
  AV1_COMMON *volatile const cm = &pbi->common;
  const uint8_t *source = *psource;
  pbi->error.error_code = AOM_CODEC_OK;
  pbi->error.has_detail = 0;

  if (size == 0) {
    // This is used to signal that we are missing frames.
    // We do not know if the missing frame(s) was supposed to update
    // any of the reference buffers, but we act conservative and
    // mark only the last buffer as corrupted.
    //
    // TODO(jkoleszar): Error concealment is undefined and non-normative
    // at this point, but if it becomes so, [0] may not always be the correct
    // thing to do here.
    RefCntBuffer *ref_buf = get_ref_frame_buf(cm, LAST_FRAME);
    if (ref_buf != NULL) ref_buf->buf.corrupted = 1;
  }

  if (assign_cur_frame_new_fb(cm) == NULL) {
    pbi->error.error_code = AOM_CODEC_MEM_ERROR;
    return 1;
  }

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(pbi->error.jmp)) {
    const AVxWorkerInterface *const winterface = aom_get_worker_interface();
    int i;

    pbi->error.setjmp = 0;

    // Synchronize all threads immediately as a subsequent decode call may
    // cause a resize invalidating some allocations.
    winterface->sync(&pbi->lf_worker);
    for (i = 0; i < pbi->num_workers; ++i) {
      winterface->sync(&pbi->tile_workers[i]);
    }

    release_current_frame(pbi);
    return -1;
  }

  pbi->error.setjmp = 1;

  int frame_decoded =
      aom_decode_frame_from_obus(pbi, source, source + size, psource);

  if (frame_decoded < 0) {
    assert(pbi->error.error_code != AOM_CODEC_OK);
    release_current_frame(pbi);
    pbi->error.setjmp = 0;
    return 1;
  }

#if TXCOEFF_TIMER
  cm->cum_txcoeff_timer += cm->txcoeff_timer;
  fprintf(stderr,
          "txb coeff block number: %d, frame time: %ld, cum time %ld in us\n",
          cm->txb_count, cm->txcoeff_timer, cm->cum_txcoeff_timer);
  cm->txcoeff_timer = 0;
  cm->txb_count = 0;
#endif

  // Note: At this point, this function holds a reference to cm->cur_frame
  // in the buffer pool. This reference is consumed by update_frame_buffers().
  update_frame_buffers(pbi, frame_decoded);

  if (frame_decoded) {
    pbi->decoding_first_frame = 0;
  }

  if (pbi->error.error_code != AOM_CODEC_OK) {
    pbi->error.setjmp = 0;
    return 1;
  }

  if (!cm->show_existing_frame) {
    if (cm->seg.enabled) {
      if (cm->prev_frame &&
          (cm->mi_params.mi_rows == cm->prev_frame->mi_rows) &&
          (cm->mi_params.mi_cols == cm->prev_frame->mi_cols)) {
        cm->last_frame_seg_map = cm->prev_frame->seg_map;
      } else {
        cm->last_frame_seg_map = NULL;
      }
    }
  }

  // Update progress in frame parallel decode.
  pbi->error.setjmp = 0;

  return 0;
}